

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O3

int ssl_cert_cache_chain_certs(CERT *cert)

{
  ssl_credential_st *psVar1;
  tuple<stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter> sk;
  _Head_base<0UL,_stack_st_X509_*,_false> _Var2;
  size_t sVar3;
  CRYPTO_BUFFER *buf;
  X509 *p;
  int iVar4;
  ulong i;
  UniquePtr<X509> x509;
  UniquePtr<struct_stack_st_X509> chain;
  _Head_base<0UL,_x509_st_*,_false> local_48;
  _Head_base<0UL,_stack_st_X509_*,_false> local_40;
  _Head_base<0UL,_x509_st_*,_false> local_38;
  
  if (cert->x509_method == (SSL_X509_METHOD *)0x0) {
    __assert_fail("cert->x509_method",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                  ,0x2e6,"int ssl_cert_cache_chain_certs(CERT *)");
  }
  iVar4 = 1;
  if (cert->x509_chain == (stack_st_X509 *)0x0) {
    psVar1 = (cert->legacy_credential)._M_t.
             super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
    sk.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter> *)
          &(psVar1->chain)._M_t.
           super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>;
    if (sk.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl !=
        (_Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>)0x0) {
      sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)
                             sk.
                             super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                             .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl);
      if (1 < sVar3) {
        local_40._M_head_impl = (stack_st_X509 *)OPENSSL_sk_new_null();
        iVar4 = 0;
        if ((OPENSSL_STACK *)local_40._M_head_impl != (OPENSSL_STACK *)0x0) {
          i = 1;
          while( true ) {
            sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)
                                   (psVar1->chain)._M_t.
                                   super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                  );
            _Var2._M_head_impl = local_40._M_head_impl;
            if (sVar3 <= i) break;
            buf = (CRYPTO_BUFFER *)
                  OPENSSL_sk_value((OPENSSL_STACK *)
                                   (psVar1->chain)._M_t.
                                   super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                   ,i);
            p = X509_parse_from_buffer(buf);
            local_48._M_head_impl = p;
            if (p == (X509 *)0x0) {
LAB_0015f5c9:
              std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_48);
              goto LAB_0015f5d1;
            }
            local_48._M_head_impl = (X509 *)0x0;
            local_38._M_head_impl = p;
            sVar3 = OPENSSL_sk_push((OPENSSL_STACK *)local_40._M_head_impl,p);
            if (sVar3 == 0) {
              std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_38);
              goto LAB_0015f5c9;
            }
            local_38._M_head_impl = (X509 *)0x0;
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_38);
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_48);
            i = i + 1;
          }
          local_40._M_head_impl = (stack_st_X509 *)0x0;
          cert->x509_chain = _Var2._M_head_impl;
          iVar4 = 1;
        }
LAB_0015f5d1:
        std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&local_40);
      }
    }
  }
  return iVar4;
}

Assistant:

static int ssl_cert_cache_chain_certs(CERT *cert) {
  assert(cert->x509_method);

  const SSL_CREDENTIAL *cred = cert->legacy_credential.get();
  if (cert->x509_chain != nullptr || cred->chain == nullptr ||
      sk_CRYPTO_BUFFER_num(cred->chain.get()) < 2) {
    return 1;
  }

  UniquePtr<STACK_OF(X509)> chain(sk_X509_new_null());
  if (!chain) {
    return 0;
  }

  for (size_t i = 1; i < sk_CRYPTO_BUFFER_num(cred->chain.get()); i++) {
    CRYPTO_BUFFER *buffer = sk_CRYPTO_BUFFER_value(cred->chain.get(), i);
    UniquePtr<X509> x509(X509_parse_from_buffer(buffer));
    if (!x509 ||  //
        !PushToStack(chain.get(), std::move(x509))) {
      return 0;
    }
  }

  cert->x509_chain = chain.release();
  return 1;
}